

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_gainer_get_heap_size(ma_gainer_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  undefined1 local_40 [8];
  ma_gainer_heap_layout heapLayout;
  ma_result result;
  size_t *pHeapSizeInBytes_local;
  ma_gainer_config *pConfig_local;
  
  if (pHeapSizeInBytes == (size_t *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pHeapSizeInBytes = 0;
    mVar1 = ma_gainer_get_heap_layout(pConfig,(ma_gainer_heap_layout *)local_40);
    if (mVar1 == MA_SUCCESS) {
      *pHeapSizeInBytes = (size_t)local_40;
      pConfig_local._4_4_ = MA_SUCCESS;
    }
    else {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_gainer_get_heap_size(const ma_gainer_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_gainer_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_gainer_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}